

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userop.cc
# Opt level: O0

UserPcodeOp * __thiscall UserOpManage::getOp(UserOpManage *this,string *nm)

{
  bool bVar1;
  reference ppVar2;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UserPcodeOp_*>_>
  local_28;
  const_iterator iter;
  string *nm_local;
  UserOpManage *this_local;
  
  iter._M_node = (_Base_ptr)nm;
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UserPcodeOp_*>_>
  ::_Rb_tree_const_iterator(&local_28);
  local_30 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UserPcodeOp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UserPcodeOp_*>_>_>
             ::find(&this->useropmap,iter._M_node);
  local_28._M_node = local_30;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UserPcodeOp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UserPcodeOp_*>_>_>
       ::end(&this->useropmap);
  bVar1 = std::operator==(&local_28,&local_38);
  if (bVar1) {
    this_local = (UserOpManage *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UserPcodeOp_*>_>
             ::operator*(&local_28);
    this_local = (UserOpManage *)ppVar2->second;
  }
  return (UserPcodeOp *)this_local;
}

Assistant:

UserPcodeOp *UserOpManage::getOp(const string &nm) const

{
  map<string,UserPcodeOp *>::const_iterator iter;
  iter = useropmap.find(nm);
  if (iter == useropmap.end()) return (UserPcodeOp *)0;
  return (*iter).second;
}